

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sp-test.cc
# Opt level: O2

void __thiscall SPTest_ConWithRandomVar_Test::TestBody(SPTest_ConWithRandomVar_Test *this)

{
  int iVar1;
  pointer piVar2;
  ColProblem *pCVar3;
  char *pcVar4;
  LinearConHandler LVar5;
  AssertHelper local_740;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_738;
  AssertionResult gtest_ar;
  ColumnSizeHandler cols;
  SPAdapter sp;
  TestProblem p;
  NLHeader header;
  
  MakeHeader(&header,1,0);
  header.super_NLProblemInfo.super_NLProblemInfo_C.num_con_nonzeros = 1;
  TestProblem::TestProblem(&p,&header);
  TestProblem::MakeTestRV(&p);
  mp::BasicProblem<mp::BasicProblemParams<int>_>::AddCon
            ((BasicProblem<mp::BasicProblemParams<int>_> *)&p,0.0,0.0);
  cols.problem_ = p.builder_.super_NLProblemBuilder<mp::ColProblem>.builder_;
  mp::ColProblemBuilder::ColumnSizeHandler::Add(&cols,1);
  LVar5 = TestProblem::OnLinearConExpr(&p,0);
  pCVar3 = LVar5.problem_;
  piVar2 = (pCVar3->col_starts_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  iVar1 = piVar2[1];
  piVar2[1] = iVar1 + 1;
  (pCVar3->row_indices_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start[iVar1] = LVar5.con_index_;
  (pCVar3->coefs_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start[iVar1] = 1.0;
  mp::SPAdapter::SPAdapter(&sp,&p.super_ColProblem);
  local_738.ptr_._0_4_ = 1;
  local_740.data_._0_4_ =
       (int)(((long)((sp.problem_)->super_Problem).algebraic_cons_.
                    super__Vector_base<mp::BasicProblem<mp::BasicProblemParams<int>_>::AlgebraicConInfo,_std::allocator<mp::BasicProblem<mp::BasicProblemParams<int>_>::AlgebraicConInfo>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
             (long)((sp.problem_)->super_Problem).algebraic_cons_.
                   super__Vector_base<mp::BasicProblem<mp::BasicProblemParams<int>_>::AlgebraicConInfo,_std::allocator<mp::BasicProblem<mp::BasicProblemParams<int>_>::AlgebraicConInfo>_>
                   ._M_impl.super__Vector_impl_data._M_start) / 0x88);
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&gtest_ar,"1","sp.num_cons()",(int *)&local_738,(int *)&local_740);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_738);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_740,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/sp-test.cc",0x20f,
               pcVar4);
    testing::internal::AssertHelper::operator=(&local_740,(Message *)&local_738);
    testing::internal::AssertHelper::~AssertHelper(&local_740);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(&local_738);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  local_738.ptr_._0_4_ = 2;
  local_740.data_._0_4_ = sp.num_stages_;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&gtest_ar,"2","sp.num_stages()",(int *)&local_738,(int *)&local_740);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_738);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_740,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/sp-test.cc",0x210,
               pcVar4);
    testing::internal::AssertHelper::operator=(&local_740,(Message *)&local_738);
    testing::internal::AssertHelper::~AssertHelper(&local_740);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(&local_738);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  local_738.ptr_._0_4_ = 0;
  local_740.data_._0_4_ =
       *sp.num_stage_cons_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&gtest_ar,"0","sp.stage(0).num_cons()",(int *)&local_738,(int *)&local_740)
  ;
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_738);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_740,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/sp-test.cc",0x211,
               pcVar4);
    testing::internal::AssertHelper::operator=(&local_740,(Message *)&local_738);
    testing::internal::AssertHelper::~AssertHelper(&local_740);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(&local_738);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  local_738.ptr_._0_4_ = 1;
  local_740.data_._0_4_ =
       sp.num_stage_cons_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
       super__Vector_impl_data._M_start[1];
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&gtest_ar,"1","sp.stage(1).num_cons()",(int *)&local_738,(int *)&local_740)
  ;
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_738);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_740,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/sp-test.cc",0x212,
               pcVar4);
    testing::internal::AssertHelper::operator=(&local_740,(Message *)&local_738);
    testing::internal::AssertHelper::~AssertHelper(&local_740);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(&local_738);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  mp::SPAdapter::~SPAdapter(&sp);
  mp::ColProblem::~ColProblem(&p.super_ColProblem);
  return;
}

Assistant:

TEST(SPTest, ConWithRandomVar) {
  // Test that constraint that contains a random var belongs at least to
  // the second stage.
  auto header = MakeHeader(1);
  header.num_con_nonzeros = 1;
  TestProblem p(header);
  p.MakeTestRV();
  p.AddCon(0, 0);
  auto cols = p.OnColumnSizes();
  cols.Add(1);
  auto expr = p.OnLinearConExpr(0);
  expr.AddTerm(0, 1);
  mp::SPAdapter sp(p);
  EXPECT_EQ(1, sp.num_cons());
  EXPECT_EQ(2, sp.num_stages());
  EXPECT_EQ(0, sp.stage(0).num_cons());
  EXPECT_EQ(1, sp.stage(1).num_cons());
}